

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroProp.cpp
# Opt level: O2

Vector3d * __thiscall
OpenMD::HydroProp::getCenterOfDiffusion
          (Vector3d *__return_storage_ptr__,HydroProp *this,RealType temperature)

{
  Vector3d tmpVec;
  Vector<double,_3U> local_2b8;
  Vector<double,_3U> local_2a0;
  Vector3d origin;
  Mat3x3d Dotr;
  RectMatrix<double,_3U,_3U> local_228;
  Mat3x3d tmp;
  Mat3x3d Dorr;
  Mat6x6d Do;
  
  Dotr.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  Vector<double,_3U>::Vector((Vector<double,_3U> *)&Do,(double *)&Dotr);
  Vector<double,_3U>::Vector(&origin.super_Vector<double,_3U>,(Vector<double,_3U> *)&Do);
  Vector<double,_3U>::Vector(&local_2a0,&origin.super_Vector<double,_3U>);
  getDiffusionTensorAtPos(&Do,this,(Vector3d *)&local_2a0,temperature);
  SquareMatrix<double,_3>::SquareMatrix(&Dotr.super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&Dorr.super_SquareMatrix<double,_3>);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            ((RectMatrix<double,6u,6u> *)&Do,3,0,
             (SquareMatrix3<double> *)&Dotr.super_SquareMatrix<double,_3>);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            ((RectMatrix<double,6u,6u> *)&Do,3,3,
             (SquareMatrix3<double> *)&Dorr.super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&tmp.super_SquareMatrix<double,_3>);
  Vector<double,_3U>::Vector(&tmpVec.super_Vector<double,_3U>);
  tmp.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
       Dorr.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] +
       Dorr.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2];
  tmp.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] =
       -Dorr.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1];
  tmp.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] =
       -Dorr.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2];
  tmp.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] =
       Dorr.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] +
       Dorr.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
  tmp.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] =
       -Dorr.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2];
  tmp.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] =
       Dorr.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] +
       Dorr.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
  tmpVec.super_Vector<double,_3U>.data_[0] =
       Dotr.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] -
       Dotr.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1];
  tmpVec.super_Vector<double,_3U>.data_[1] =
       Dotr.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] -
       Dotr.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2];
  tmpVec.super_Vector<double,_3U>.data_[2] =
       Dotr.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] -
       Dotr.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0];
  tmp.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] =
       tmp.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1];
  tmp.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] =
       tmp.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2];
  tmp.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] =
       tmp.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2];
  SquareMatrix3<double>::inverse
            ((SquareMatrix3<double> *)&local_228,
             (SquareMatrix3<double> *)&tmp.super_SquareMatrix<double,_3>);
  operator*(&local_2b8,&local_228,&tmpVec.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&__return_storage_ptr__->super_Vector<double,_3U>,&local_2b8);
  return __return_storage_ptr__;
}

Assistant:

Vector3d HydroProp::getCenterOfDiffusion(RealType temperature) {
    // First get the Diffusion tensor at the origin of the coordinate system:

    Vector3d origin(0.0);
    Mat6x6d Do = getDiffusionTensorAtPos(origin, temperature);

    Mat3x3d Dotr;
    Mat3x3d Dorr;

    Do.getSubMatrix(3, 0, Dotr);
    Do.getSubMatrix(3, 3, Dorr);

    Mat3x3d tmp;
    Vector3d tmpVec;

    // Find center of diffusion
    tmp(0, 0) = Dorr(1, 1) + Dorr(2, 2);
    tmp(0, 1) = -Dorr(0, 1);
    tmp(0, 2) = -Dorr(0, 2);
    tmp(1, 0) = -Dorr(0, 1);
    tmp(1, 1) = Dorr(0, 0) + Dorr(2, 2);
    tmp(1, 2) = -Dorr(1, 2);
    tmp(2, 0) = -Dorr(0, 2);
    tmp(2, 1) = -Dorr(1, 2);
    tmp(2, 2) = Dorr(1, 1) + Dorr(0, 0);

    // Vector3d tmpVec;
    tmpVec[0] = Dotr(1, 2) - Dotr(2, 1);
    tmpVec[1] = Dotr(2, 0) - Dotr(0, 2);
    tmpVec[2] = Dotr(0, 1) - Dotr(1, 0);

    // center of difussion
    Vector3d cod = tmp.inverse() * tmpVec;
    return cod;
  }